

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_shift_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i32 ret;
  ulong arg2;
  TCGv_i64 pTVar1;
  uintptr_t o;
  uint arg2_00;
  
  if (rt == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  arg2_00 = (ushort)imm & 0x1f;
  arg2 = (ulong)arg2_00;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rs);
  switch(opc) {
  case 0x38:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    break;
  case 0x39:
  case 0x3d:
    goto switchD_0086f40e_caseD_39;
  case 0x3a:
switchD_0086f40e_caseD_3a:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    goto LAB_0086f59f;
  case 0x3b:
switchD_0086f40e_caseD_3b:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    goto LAB_0086f4ca;
  case 0x3c:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
    break;
  case 0x3e:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
LAB_0086f59f:
    tcg_gen_shri_i64_mips64el(tcg_ctx,pTVar1,t,arg2);
    goto switchD_0086f40e_caseD_39;
  case 0x3f:
    pTVar1 = tcg_ctx->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
LAB_0086f4ca:
    tcg_gen_sari_i64_mips64el(tcg_ctx,pTVar1,t,arg2);
    goto switchD_0086f40e_caseD_39;
  default:
    if (opc == 0x20003e) {
      pTVar1 = tcg_ctx->cpu_gpr[rt];
      arg2_00 = arg2_00 | 0x20;
LAB_0086f568:
      tcg_gen_rotri_i64_mips64el(tcg_ctx,pTVar1,t,arg2_00);
      goto switchD_0086f40e_caseD_39;
    }
    if (opc == 2) {
      if (arg2 != 0) {
        tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
        goto switchD_0086f40e_caseD_3a;
      }
    }
    else {
      if (opc == 3) goto switchD_0086f40e_caseD_3b;
      if (opc == 0x200002) {
        if (arg2 != 0) {
          ret = tcg_temp_new_i32(tcg_ctx);
          tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t);
          tcg_gen_rotri_i32_mips64el(tcg_ctx,ret,ret,arg2_00);
          tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rt],ret);
          tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
          goto switchD_0086f40e_caseD_39;
        }
      }
      else {
        if (opc == 0x20003a) {
          pTVar1 = tcg_ctx->cpu_gpr[rt];
          if ((imm & 0x1fU) == 0) {
            tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar1,t);
            goto switchD_0086f40e_caseD_39;
          }
          goto LAB_0086f568;
        }
        if (opc != 0) goto switchD_0086f40e_caseD_39;
        tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,arg2);
      }
    }
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rt],t);
    goto switchD_0086f40e_caseD_39;
  }
  tcg_gen_shli_i64_mips64el(tcg_ctx,pTVar1,t,arg2);
switchD_0086f40e_caseD_39:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_shift_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = ((uint16_t)imm) & 0x1f;
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLL:
        tcg_gen_shli_tl(tcg_ctx, t0, t0, uimm);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        break;
    case OPC_SRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SRL:
        if (uimm != 0) {
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_ROTR:
        if (uimm != 0) {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
            tcg_gen_rotri_i32(tcg_ctx, t1, t1, uimm);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t1);
            tcg_temp_free_i32(tcg_ctx, t1);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLL:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRL:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DROTR:
        if (uimm != 0) {
            tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_DSLL32:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRA32:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRL32:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DROTR32:
        tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}